

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameWalkTrigger(Walker *pWalker,Trigger *pTrigger)

{
  Upsert *pUVar1;
  TriggerStep *pTVar2;
  Upsert *pUpsert;
  
  if (pTrigger->pWhen != (Expr *)0x0) {
    walkExpr(pWalker,pTrigger->pWhen);
  }
  for (pTVar2 = pTrigger->step_list; pTVar2 != (TriggerStep *)0x0; pTVar2 = pTVar2->pNext) {
    sqlite3WalkSelect(pWalker,pTVar2->pSelect);
    if (pTVar2->pWhere != (Expr *)0x0) {
      walkExpr(pWalker,pTVar2->pWhere);
    }
    sqlite3WalkExprList(pWalker,pTVar2->pExprList);
    pUVar1 = pTVar2->pUpsert;
    if (pUVar1 != (Upsert *)0x0) {
      sqlite3WalkExprList(pWalker,pUVar1->pUpsertTarget);
      sqlite3WalkExprList(pWalker,pUVar1->pUpsertSet);
      if (pUVar1->pUpsertWhere != (Expr *)0x0) {
        walkExpr(pWalker,pUVar1->pUpsertWhere);
      }
      if (pUVar1->pUpsertTargetWhere != (Expr *)0x0) {
        walkExpr(pWalker,pUVar1->pUpsertTargetWhere);
      }
    }
  }
  return;
}

Assistant:

static void renameWalkTrigger(Walker *pWalker, Trigger *pTrigger){
  TriggerStep *pStep;

  /* Find tokens to edit in WHEN clause */
  sqlite3WalkExpr(pWalker, pTrigger->pWhen);

  /* Find tokens to edit in trigger steps */
  for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
    sqlite3WalkSelect(pWalker, pStep->pSelect);
    sqlite3WalkExpr(pWalker, pStep->pWhere);
    sqlite3WalkExprList(pWalker, pStep->pExprList);
    if( pStep->pUpsert ){
      Upsert *pUpsert = pStep->pUpsert;
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertTarget);
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertSet);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertWhere);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertTargetWhere);
    }
  }
}